

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O0

void runOnce<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  rep rVar8;
  ulong uVar9;
  type diff;
  time_point end_time;
  int64_t cursor;
  int i_4;
  int i_3;
  int i_2;
  time_point start_time;
  thread *tp;
  int i_1;
  thread *tc;
  int i;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64> s;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  Sequence *sequences;
  memory_order __b_1;
  memory_order __b;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
  *in_stack_fffffffffffffa40;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
  *in_stack_fffffffffffffa48;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffa50;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *this;
  size_t in_stack_fffffffffffffa60;
  ulong *puVar10;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
  *in_stack_fffffffffffffa68;
  ulong *puVar11;
  reference_wrapper<disruptor::Sequence> *in_stack_fffffffffffffa70;
  reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>_>
  *in_stack_fffffffffffffa78;
  ulong *puVar12;
  _func_void_Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>_ptr_Sequence_ptr
  *in_stack_fffffffffffffa80;
  thread *in_stack_fffffffffffffa88;
  char *in_stack_fffffffffffffaa0;
  ulong *local_458;
  ulong *local_428;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *local_3f8;
  duration<long,_std::ratio<1L,_1000L>_> local_3d0;
  duration<long,_std::ratio<1L,_1000L>_> local_3c8;
  string local_3c0 [32];
  string local_3a0 [32];
  rep local_380;
  undefined8 local_378;
  int64_t local_370;
  int local_368;
  int local_364;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
  *local_360;
  int local_34c;
  undefined8 local_348;
  ulong *local_340;
  Sequence *local_338;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
  *local_330;
  int local_31c;
  ulong *local_318;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *local_310;
  int local_304;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *local_90;
  __atomic_base<long> local_88;
  memory_order local_80;
  undefined4 local_7c;
  atomic<long> *local_78;
  __int_type local_70;
  memory_order local_68;
  int local_64;
  __atomic_base<long> local_60;
  atomic<long> *local_58;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Staring run ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_58 = &sum;
  local_60._M_i = 0;
  local_64 = 5;
  local_68 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_70 = local_60._M_i;
  if ((local_64 != 3) && (local_64 == 5)) {
    LOCK();
    UNLOCK();
  }
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)(__atomic_base<long>)local_60._M_i;
  uVar5 = (ulong)nc;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x78),0);
  if (SUB168(auVar1 * ZEXT816(0x78),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_90 = (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             operator_new__(uVar6);
  if (uVar5 != 0) {
    local_3f8 = local_90;
    do {
      disruptor::Sequence::Sequence
                ((Sequence *)in_stack_fffffffffffffa48,(int64_t)in_stack_fffffffffffffa40);
      local_3f8 = local_3f8 + 5;
    } while (local_3f8 != local_90 + uVar5 * 5);
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x1670be);
  disruptor::
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>::
  Sequencer(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  for (local_304 = 0; local_304 < nc; local_304 = local_304 + 1) {
    local_310 = local_90 + (long)local_304 * 5;
    std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::push_back
              ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
               in_stack_fffffffffffffa48,(value_type *)in_stack_fffffffffffffa40);
  }
  disruptor::
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>::
  set_gating_sequences
            (in_stack_fffffffffffffa48,
             (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             in_stack_fffffffffffffa40);
  uVar5 = (ulong)nc;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_318 = (ulong *)operator_new__(uVar9);
  *local_318 = uVar5;
  local_318 = local_318 + 1;
  if (uVar5 != 0) {
    local_428 = local_318;
    do {
      std::thread::thread((thread *)0x167251);
      local_428 = local_428 + 1;
    } while (local_428 != local_318 + uVar5);
  }
  for (local_31c = 0; local_31c < nc; local_31c = local_31c + 1) {
    local_330 = (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>,64>>
                             (in_stack_fffffffffffffa40);
    local_338 = (Sequence *)std::ref<disruptor::Sequence>((Sequence *)in_stack_fffffffffffffa40);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>,64>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>,64>>,std::reference_wrapper<disruptor::Sequence>,void>
              (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               in_stack_fffffffffffffa70);
    std::thread::operator=((thread *)in_stack_fffffffffffffa48,(thread *)in_stack_fffffffffffffa40);
    std::thread::~thread((thread *)0x167330);
  }
  uVar5 = (ulong)np;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_340 = (ulong *)operator_new__(uVar9);
  *local_340 = uVar5;
  local_340 = local_340 + 1;
  if (uVar5 != 0) {
    local_458 = local_340;
    do {
      std::thread::thread((thread *)0x1673eb);
      local_458 = local_458 + 1;
    } while (local_458 != local_340 + uVar5);
  }
  local_348 = std::chrono::_V2::system_clock::now();
  for (local_34c = 0; local_34c < np; local_34c = local_34c + 1) {
    local_360 = (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>,64>>
                             (in_stack_fffffffffffffa40);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>,64>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>,64>>,void>
              (in_stack_fffffffffffffa88,
               (_func_void_Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>_ptr
                *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    std::thread::operator=((thread *)in_stack_fffffffffffffa48,(thread *)in_stack_fffffffffffffa40);
    std::thread::~thread((thread *)0x1674a7);
  }
  for (local_364 = 0; local_364 < np; local_364 = local_364 + 1) {
    std::thread::join();
  }
  for (local_368 = 0; local_368 < nc; local_368 = local_368 + 1) {
    std::thread::join();
  }
  local_370 = disruptor::
              Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
              ::GetCursor((Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
                           *)0x16755e);
  poVar4 = std::operator<<((ostream *)&std::cout,"\nBatch size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,delta);
  poVar4 = std::operator<<(poVar4," Ring buffer size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,RING_BUFFER_SIZE);
  poVar4 = std::operator<<(poVar4," Alignment: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x40);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Cursor: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_370);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Sum: ");
  local_78 = &sum;
  local_7c = 5;
  local_80 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_88 = sum.super___atomic_base<long>._M_i;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)sum.super___atomic_base<long>._M_i);
  poVar4 = std::operator<<(poVar4," Expected sum: ");
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,(expectedValue * (expectedValue + 1) * (long)nc) / 2);
  std::operator<<(poVar4,'\n');
  local_378 = std::chrono::_V2::system_clock::now();
  local_380 = (rep)std::chrono::operator-
                             (in_stack_fffffffffffffa50,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffa48);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,np);
  poVar4 = std::operator<<(poVar4,"P-");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,nc);
  poVar4 = std::operator<<(poVar4,"C ");
  std::type_info::name((type_info *)&disruptor::MultiThreadedStrategy::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffaa0);
  poVar4 = std::operator<<(poVar4,local_3a0);
  poVar4 = std::operator<<(poVar4," ");
  std::type_info::name((type_info *)&disruptor::YieldingStrategy<200l>::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffaa0);
  poVar4 = std::operator<<(poVar4,local_3c0);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_3a0);
  lVar7 = local_370 * 1000;
  local_3c8.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffa40);
  rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_3c8);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,lVar7 / rVar8);
  poVar4 = std::operator<<(poVar4," ops/secs");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Milliseconds: ");
  local_3d0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffa40);
  rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_3d0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar8);
  std::operator<<(poVar4,"\n\n");
  puVar12 = local_318;
  if (local_318 != (ulong *)0x0) {
    puVar11 = local_318 + -1;
    puVar10 = local_318 + local_318[-1];
    while (puVar12 != puVar10) {
      puVar10 = puVar10 + -1;
      std::thread::~thread((thread *)0x167ad0);
    }
    operator_delete__(puVar11);
  }
  if (local_340 != (ulong *)0x0) {
    puVar11 = local_340 + -1;
    puVar10 = local_340 + local_340[-1];
    puVar12 = local_340;
    if (local_340 != puVar10) {
      do {
        puVar10 = puVar10 + -1;
        std::thread::~thread((thread *)0x167b3d);
      } while (puVar10 != puVar12);
    }
    operator_delete__(puVar11);
  }
  this = local_90;
  if (local_90 != (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x0) {
    operator_delete__(local_90);
  }
  disruptor::
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>::
  ~Sequencer(in_stack_fffffffffffffa48);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector(this);
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W, Alignment> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE
            << " Alignment: " << Alignment << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  // std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n";

  std::cout << "Milliseconds: " << std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                          .count() << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}